

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::addSourcePrefix
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr prefix)

{
  bool bVar1;
  StringPtr pathStr;
  CompilerMain *local_28;
  CompilerMain *this_local;
  StringPtr prefix_local;
  
  prefix_local.content.ptr = (char *)prefix.content.size_;
  pathStr.content.size_ = (CompilerMain *)prefix.content.ptr;
  pathStr.content.ptr = (char *)this;
  local_28 = this;
  this_local = pathStr.content.size_;
  prefix_local.content.size_ = (size_t)__return_storage_ptr__;
  getSourceDirectory((CompilerMain *)&stack0xffffffffffffffd0,pathStr,prefix.content.size_._0_1_);
  bVar1 = kj::Maybe<const_kj::ReadableDirectory_&>::operator==
                    ((Maybe<const_kj::ReadableDirectory_&> *)&stack0xffffffffffffffd0);
  if (bVar1) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such directory");
  }
  else {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSourcePrefix(kj::StringPtr prefix) {
    if (getSourceDirectory(prefix, true) == kj::none) {
      return "no such directory";
    } else {
      return true;
    }
  }